

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O0

RETRY_CONTROL_HANDLE
retry_control_create(IOTHUB_CLIENT_RETRY_POLICY policy,uint max_retry_time_in_secs)

{
  LOGGER_LOG p_Var1;
  TICK_COUNTER_HANDLE pTVar2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  RETRY_CONTROL_INSTANCE *retry_control;
  uint max_retry_time_in_secs_local;
  IOTHUB_CLIENT_RETRY_POLICY policy_local;
  
  l = (LOGGER_LOG)malloc(0x38);
  if ((RETRY_CONTROL_HANDLE)l == (RETRY_CONTROL_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"retry_control_create",0x125,1,"Failed creating the retry control (malloc failed)")
      ;
    }
  }
  else {
    memset(l,0,0x38);
    pTVar2 = tickcounter_create();
    ((RETRY_CONTROL_HANDLE)l)->tick_counter = pTVar2;
    if (pTVar2 == (TICK_COUNTER_HANDLE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                  ,"retry_control_create",300,1,
                  "Failed creating the retry controller (tickcounter_create failed)");
      }
      free(l);
      l = (LOGGER_LOG)0x0;
    }
    else {
      ((RETRY_CONTROL_HANDLE)l)->policy = policy;
      ((RETRY_CONTROL_HANDLE)l)->max_retry_time_in_secs = max_retry_time_in_secs;
      if ((((RETRY_CONTROL_HANDLE)l)->policy == IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF) ||
         (((RETRY_CONTROL_HANDLE)l)->policy == IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF_WITH_JITTER))
      {
        ((RETRY_CONTROL_HANDLE)l)->initial_wait_time_in_secs = 1;
      }
      else {
        ((RETRY_CONTROL_HANDLE)l)->initial_wait_time_in_secs = 5;
      }
      ((RETRY_CONTROL_HANDLE)l)->max_jitter_percent = 5;
      ((RETRY_CONTROL_HANDLE)l)->max_delay_in_secs = 0x1e;
      retry_control_reset((RETRY_CONTROL_HANDLE)l);
    }
  }
  return (RETRY_CONTROL_HANDLE)l;
}

Assistant:

RETRY_CONTROL_HANDLE retry_control_create(IOTHUB_CLIENT_RETRY_POLICY policy, unsigned int max_retry_time_in_secs)
{
    RETRY_CONTROL_INSTANCE* retry_control;

    if ((retry_control = (RETRY_CONTROL_INSTANCE*)malloc(sizeof(RETRY_CONTROL_INSTANCE))) == NULL)
    {
        LogError("Failed creating the retry control (malloc failed)");
    }
    else
    {
        memset(retry_control, 0, sizeof(RETRY_CONTROL_INSTANCE));
        if ((retry_control->tick_counter = tickcounter_create()) == NULL)
        {
            LogError("Failed creating the retry controller (tickcounter_create failed)");
            free(retry_control);
            retry_control = NULL;
        }
        else
        {
            retry_control->policy = policy;
            retry_control->max_retry_time_in_secs = max_retry_time_in_secs;

            if (retry_control->policy == IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF ||
                retry_control->policy == IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF_WITH_JITTER)
            {
                retry_control->initial_wait_time_in_secs = 1;
            }
            else
            {
                retry_control->initial_wait_time_in_secs = 5;
            }

            retry_control->max_jitter_percent = 5;
            retry_control->max_delay_in_secs = DEFAULT_MAX_DELAY_IN_SECS;

            retry_control_reset(retry_control);
        }
    }

    return (RETRY_CONTROL_HANDLE)retry_control;
}